

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_read_header_property(p_ply ply)

{
  int iVar1;
  e_ply_type eVar2;
  p_ply ply_00;
  p_ply_property_conflict list;
  long in_RDI;
  p_ply_property_conflict property;
  p_ply_element element;
  p_ply in_stack_ffffffffffffffd8;
  p_ply_element element_00;
  int local_4;
  
  element_00 = (p_ply_element)0x0;
  iVar1 = strcmp((char *)(in_RDI + 0x4c + *(long *)(in_RDI + 0x2058)),"property");
  if (iVar1 == 0) {
    ply_00 = (p_ply)(*(long *)(in_RDI + 8) + (*(long *)(in_RDI + 0x10) + -1) * 0x118);
    list = ply_grow_property(ply_00,element_00);
    if (list == (p_ply_property_conflict)0x0) {
      local_4 = 0;
    }
    else {
      iVar1 = ply_read_word(in_stack_ffffffffffffffd8);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        eVar2 = ply_find_string((char *)ply_00,(char **)list);
        list->type = eVar2;
        if (list->type == ~PLY_INT8) {
          local_4 = 0;
        }
        else {
          if (list->type == PLY_LIST) {
            iVar1 = ply_read_word(in_stack_ffffffffffffffd8);
            if (iVar1 == 0) {
              return 0;
            }
            eVar2 = ply_find_string((char *)ply_00,(char **)list);
            list->length_type = eVar2;
            if (list->length_type == ~PLY_INT8) {
              return 0;
            }
            iVar1 = ply_read_word(in_stack_ffffffffffffffd8);
            if (iVar1 == 0) {
              return 0;
            }
            eVar2 = ply_find_string((char *)ply_00,(char **)list);
            list->value_type = eVar2;
            if (list->value_type == ~PLY_INT8) {
              return 0;
            }
          }
          iVar1 = ply_read_word(in_stack_ffffffffffffffd8);
          if (iVar1 == 0) {
            local_4 = 0;
          }
          else {
            strcpy(list->name,(char *)(in_RDI + 0x4c + *(long *)(in_RDI + 0x2058)));
            iVar1 = ply_read_word(in_stack_ffffffffffffffd8);
            if (iVar1 == 0) {
              local_4 = 0;
            }
            else {
              local_4 = 1;
            }
          }
        }
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int ply_read_header_property(p_ply ply) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    /* make sure it is a property */
    if (strcmp(BWORD(ply), "property")) return 0;
    element = &ply->element[ply->nelements - 1];
    property = ply_grow_property(ply, element);
    if (!property) return 0;
    /* get property type */
    if (!ply_read_word(ply)) return 0;
    property->type = (e_ply_type)ply_find_string(BWORD(ply), ply_type_list);
    if (property->type == (e_ply_type)(-1)) return 0;
    if (property->type == PLY_LIST) {
        /* if it's a list, we need the base types */
        if (!ply_read_word(ply)) return 0;
        property->length_type =
            (e_ply_type)ply_find_string(BWORD(ply), ply_type_list);
        if (property->length_type == (e_ply_type)(-1)) return 0;
        if (!ply_read_word(ply)) return 0;
        property->value_type =
            (e_ply_type)ply_find_string(BWORD(ply), ply_type_list);
        if (property->value_type == (e_ply_type)(-1)) return 0;
    }
    /* get property name */
    if (!ply_read_word(ply)) return 0;
    strcpy(property->name, BWORD(ply));
    if (!ply_read_word(ply)) return 0;
    return 1;
}